

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O2

void __thiscall
icu_63::UnicodeSet::exclusiveOr(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int *piVar1;
  UChar32 *pUVar2;
  UChar32 *pUVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  UChar32 UVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  undefined8 uStack_28;
  UErrorCode status;
  
  if ((this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) ||
     ((this->fFlags & 1) != 0)) {
    return;
  }
  uStack_28 = 0;
  ensureBufferCapacity(this,otherLen + this->len,&status);
  if (U_ZERO_ERROR < status) {
    return;
  }
  pUVar2 = this->list;
  iVar6 = *other;
  uVar4 = 1;
  if ((byte)(polarity - 1U) < 2) {
    uVar5 = 0;
    bVar10 = iVar6 != 0;
    iVar6 = 0;
    if (bVar10) goto LAB_002c84cc;
    iVar6 = other[1];
  }
  uVar5 = 1;
LAB_002c84cc:
  UVar7 = *pUVar2;
  pUVar3 = this->buffer;
  iVar9 = 0;
  do {
    uVar5 = (ulong)(int)uVar5;
    lVar8 = (long)iVar9;
    while (iVar9 = (int)lVar8, iVar6 <= UVar7) {
      if (UVar7 <= iVar6) {
        if (UVar7 == 0x110000) {
          pUVar3[lVar8] = 0x110000;
          this->len = iVar9 + 1;
          swapBuffers(this);
          releasePattern(this);
          return;
        }
        iVar6 = other[uVar5];
        uVar5 = (ulong)((int)uVar5 + 1);
        goto LAB_002c850f;
      }
      pUVar3[lVar8] = iVar6;
      piVar1 = other + uVar5;
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 1;
      iVar6 = *piVar1;
    }
    iVar9 = iVar9 + 1;
    pUVar3[lVar8] = UVar7;
LAB_002c850f:
    UVar7 = pUVar2[uVar4];
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}